

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O3

void InitializeMatrices(TPZSubCompMesh *submesh,
                       TPZAutoPointer<TPZDohrSubstructCondense<double>_> *substruct,
                       TPZDohrAssembly<double> *dohrassembly)

{
  ulong uVar1;
  double *pdVar2;
  TPZMatRed<double,_TPZVerySparseMatrix<double>_> *pTVar3;
  undefined8 vtt;
  int iVar4;
  mapped_type *permutescatter;
  TPZBaseMatrix *pTVar5;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar6;
  int64_t iVar7;
  TPZMatrix<double> *pTVar8;
  double *pdVar9;
  TPZDohrSubstructCondense<double> *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TPZStepSolver<double> *pTVar11;
  long lVar12;
  ulong uVar13;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *pTVar14;
  int64_t newsize;
  double extraout_XMM0_Qa;
  TPZAutoPointer<TPZMatrix<double>_> Stiffness;
  TPZAutoPointer<TPZMatrix<double>_> InternalStiffness;
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_> matred;
  TPZVec<long> permuteconnectscatter;
  TPZVec<long> invpermuteconnectscatter;
  pairnumbering fromsub;
  TPZPairStructMatrix pairstructmatrix;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> skylstr;
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  redstruct;
  TPZAutoPointer<TPZMatrix<double>_> local_2f0;
  _func_int **local_2e8;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> *local_2e0;
  TPZMatRed<double,_TPZVerySparseMatrix<double>_> *local_2d8;
  TPZAutoPointer<TPZMatrix<double>_> local_2d0;
  TPZAutoPointer<TPZMatrixSolver<double>_> local_2c8;
  TPZAutoPointer<TPZMatrixSolver<double>_> local_2c0;
  TPZAutoPointer<TPZBaseMatrix> local_2b8;
  TPZAutoPointer<TPZMatrix<double>_> local_2b0;
  TPZAutoPointer<TPZBaseMatrix> local_2a8;
  TPZAutoPointer<TPZMatrix<double>_> local_2a0;
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_> local_298;
  TPZVec<long> local_290;
  TPZAutoPointer<TPZMatrix<double>_> local_270;
  undefined8 local_268;
  undefined1 local_260 [120];
  undefined1 local_1e8 [168];
  _func_int **local_140;
  void *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  _func_int **local_120;
  long *local_118;
  int64_t iStack_110;
  int64_t local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined1 local_f4;
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  local_f0;
  
  local_260._72_8_ = 0x100000000;
  local_2e0 = substruct;
  permutescatter =
       std::
       map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
       ::operator[](&substruct->fRef->fPointer->fPermutationsScatter,(key_type *)(local_260 + 0x48))
  ;
  local_100 = 0x1924960;
  local_1e8._0_8_ = 0x1924a28;
  local_f8 = 0;
  local_f4 = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)local_1e8,&PTR_construction_vtable_104__01924280,
             &submesh->super_TPZCompMesh);
  local_100 = 0x1924438;
  local_1e8._0_8_ = 0x1924358;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)(local_1e8 + 0xa0),&PTR_construction_vtable_104__019242a8)
  ;
  local_260._8_8_ = 0x1924200;
  local_100 = 0x1924200;
  local_260._0_8_ = 0x1924038;
  local_1e8._0_8_ = 0x1924038;
  local_1e8._160_8_ = 0x1924100;
  local_140 = (_func_int **)&PTR__TPZVec_01813f30;
  local_138 = (void *)0x0;
  uStack_130 = 0;
  local_128 = 0;
  local_2e8 = (_func_int **)&PTR__TPZVec_01813f30;
  local_120 = (_func_int **)&PTR__TPZVec_01813f30;
  local_118 = (long *)0x0;
  iStack_110 = 0;
  local_108 = 0;
  local_1e8[0x58] = false;
  TPZVec<long>::Resize((TPZVec<long> *)(local_1e8 + 0x60),0);
  TPZVec<long>::Resize((TPZVec<long> *)(local_1e8 + 0x80),0);
  pTVar5 = &TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::Create
                      ((TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *)local_1e8)->
            super_TPZBaseMatrix;
  local_2f0.fRef = (TPZReference *)operator_new(0x10);
  (((TPZReference *)local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  ((TPZReference *)local_2f0.fRef)->fPointer = pTVar5;
  LOCK();
  (((TPZReference *)local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  pTVar6 = (TPZMatRed<double,_TPZFMatrix<double>_> *)operator_new(800);
  TPZMatRed<double,_TPZFMatrix<double>_>::TPZMatRed
            (pTVar6,(local_2e0->fRef->fPointer->fCoarseNodes).fNElements + pTVar5->fRow,pTVar5->fRow
            );
  local_270.fRef = local_2f0.fRef;
  LOCK();
  ((local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZMatRed<double,_TPZFMatrix<double>_>::SetK00(pTVar6,&local_270);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_270);
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator=
            (&local_2e0->fRef->fPointer->fMatRedComplete,pTVar6);
  local_290._vptr_TPZVec = local_2e8;
  local_290.fStore = (long *)0x0;
  local_290.fNElements = 0;
  local_290.fNAlloc = 0;
  iVar7 = TPZSubCompMesh::NumInternalEquations(submesh);
  local_2e0->fRef->fPointer->fNumInternalEquations = (int)iVar7;
  TPZSubCompMesh::PermuteInternalFirst(submesh,&local_290);
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  ::TPZMatRedStructMatrix(&local_f0,submesh);
  pTVar8 = TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           ::Create(&local_f0);
  if (pTVar8 == (TPZMatrix<double> *)0x0) {
    local_2d8 = (TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)0x0;
  }
  else {
    local_2d8 = (TPZMatRed<double,_TPZVerySparseMatrix<double>_> *)
                __dynamic_cast(pTVar8,&TPZMatrix<double>::typeinfo,
                               &TPZMatRed<double,TPZVerySparseMatrix<double>>::typeinfo,0);
  }
  local_298.fRef = (TPZReference *)operator_new(0x10);
  ((local_298.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_298.fRef)->fPointer = local_2d8;
  LOCK();
  ((local_298.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZPairStructMatrix::TPZPairStructMatrix
            ((TPZPairStructMatrix *)(local_260 + 0x50),&submesh->super_TPZCompMesh,permutescatter);
  TPZVec<long>::TPZVec((TPZVec<long> *)(local_260 + 0x28),local_290.fNElements);
  pTVar3 = local_2d8;
  local_268 = 0x1924100;
  if (0 < local_290.fNElements) {
    lVar12 = 0;
    do {
      *(long *)(local_260._48_8_ + local_290.fStore[lVar12] * 8) = lVar12;
      lVar12 = lVar12 + 1;
    } while (lVar12 < local_290.fNElements);
  }
  local_260._16_8_ = &PTR_construction_vtable_104__01924280;
  local_2d0.fRef = (local_2d8->fK00).fRef;
  LOCK();
  (((TPZReference *)local_2d0.fRef)->fCounter).super___atomic_base<int>._M_i =
       (((TPZReference *)local_2d0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZCompMesh::Permute(&submesh->super_TPZCompMesh,(TPZVec<long> *)(local_260 + 0x28));
  pTVar14 = local_2e0;
  pTVar10 = local_2e0->fRef->fPointer;
  uVar13 = ((local_2f0.fRef)->fPointer->super_TPZBaseMatrix).fRow;
  if (uVar13 != (pTVar10->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol *
                (pTVar10->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) {
    pdVar2 = (pTVar10->fLocalLoad).fElem;
    pdVar9 = (pTVar10->fLocalLoad).fGiven;
    if (pdVar2 != pdVar9 && pdVar2 != (double *)0x0) {
      operator_delete__(pdVar2);
      pdVar9 = (pTVar10->fLocalLoad).fGiven;
    }
    if ((pdVar9 == (double *)0x0) || ((pTVar10->fLocalLoad).fSize < (long)uVar13)) {
      if (uVar13 == 0) {
        pdVar9 = (double *)0x0;
      }
      else {
        pdVar9 = (double *)operator_new__(-(ulong)(uVar13 >> 0x3d != 0) | uVar13 * 8);
      }
    }
    (pTVar10->fLocalLoad).fElem = pdVar9;
  }
  (pTVar10->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar13;
  (pTVar10->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  (*(pTVar10->fLocalLoad).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xf])(&pTVar10->fLocalLoad);
  TPZPairStructMatrix::Assemble
            ((TPZPairStructMatrix *)(local_260 + 0x50),
             (TPZMatrix<double> *)&(local_2f0.fRef)->fPointer->super_TPZBaseMatrix,
             &pTVar3->super_TPZMatrix<double>,&pTVar14->fRef->fPointer->fLocalLoad);
  TPZMatRed<double,_TPZFMatrix<double>_>::SimetrizeMatRed(pTVar6);
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::SimetrizeMatRed(pTVar3);
  TPZManVector<double,_10>::Resize
            (&pTVar14->fRef->fPointer->fWeights,
             ((local_2f0.fRef)->fPointer->super_TPZBaseMatrix).fRow);
  pTVar10 = pTVar14->fRef->fPointer;
  if (0 < (pTVar10->fWeights).super_TPZVec<double>.fNElements) {
    lVar12 = 0;
    do {
      (*(((TPZBaseMatrix *)&((local_2f0.fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable)->
        super_TPZSavable)._vptr_TPZSavable[0x24])
                (&(local_2f0.fRef)->fPointer->super_TPZBaseMatrix,lVar12,lVar12);
      pTVar10 = pTVar14->fRef->fPointer;
      (pTVar10->fWeights).super_TPZVec<double>.fStore[lVar12] = extraout_XMM0_Qa;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pTVar10->fWeights).super_TPZVec<double>.fNElements);
  }
  local_260._32_8_ = (pTVar10->fCoarseNodes).fNElements;
  if (0 < (long)local_260._32_8_) {
    local_260._24_8_ = ((local_2f0.fRef)->fPointer->super_TPZBaseMatrix).fRow;
    lVar12 = 0;
    do {
      iVar4 = (pTVar14->fRef->fPointer->fCoarseNodes).fStore[lVar12];
      uVar13 = (ulong)iVar4;
      pTVar5 = &(local_2f0.fRef)->fPointer->super_TPZBaseMatrix;
      if (((pTVar5->fRow <= (long)uVar13) || (iVar4 < 0)) || (pTVar5->fCol <= (long)uVar13)) {
        TPZMatrix<double>::Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar4 = (*(((TPZBaseMatrix *)&pTVar5->super_TPZSavable)->super_TPZSavable)._vptr_TPZSavable
                [0x22])(pTVar5,uVar13,uVar13);
      *(double *)CONCAT44(extraout_var,iVar4) = *(double *)CONCAT44(extraout_var,iVar4) + 10.0;
      uVar1 = local_260._24_8_ + lVar12;
      if ((((pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar1) ||
          ((long)(uVar1 | uVar13) < 0)) ||
         ((pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar13)) {
        TPZMatrix<double>::Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar4 = (*(pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x22])(pTVar6,uVar1,uVar13);
      *(undefined8 *)CONCAT44(extraout_var_00,iVar4) = 0x3ff0000000000000;
      if ((((pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar13) ||
          ((long)(uVar1 | uVar13) < 0)) ||
         ((pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar1)) {
        TPZMatrix<double>::Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar4 = (*(pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x22])(pTVar6,uVar13,uVar1);
      *(undefined8 *)CONCAT44(extraout_var_01,iVar4) = 0x3ff0000000000000;
      lVar12 = lVar12 + 1;
      pTVar14 = local_2e0;
    } while (local_260._32_8_ != lVar12);
  }
  pTVar11 = (TPZStepSolver<double> *)operator_new(0x100);
  vtt = local_260._16_8_;
  pTVar3 = local_2d8;
  local_2a0.fRef = local_2f0.fRef;
  LOCK();
  ((local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(pTVar11,&local_2a0);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_2a0);
  local_2a8.fRef = (TPZReference *)local_2f0.fRef;
  LOCK();
  ((local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_2f0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*(pTVar11->super_TPZMatrixSolver<double>).super_TPZSolver.super_TPZSavable._vptr_TPZSavable[0xd])
            (pTVar11);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_2a8);
  TPZStepSolver<double>::SetDirect(pTVar11,ECholesky);
  local_2c0.fRef = (TPZReference *)0x0;
  local_2c0.fRef = (TPZReference *)operator_new(0x10);
  ((local_2c0.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_2c0.fRef)->fPointer = (TPZMatrixSolver<double> *)pTVar11;
  LOCK();
  ((local_2c0.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatRed<double,_TPZFMatrix<double>_>::SetSolver(pTVar6,&local_2c0);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer(&local_2c0);
  pTVar11 = (TPZStepSolver<double> *)operator_new(0x100);
  local_2b0.fRef = local_2d0.fRef;
  LOCK();
  ((local_2d0.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_2d0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStepSolver<double>::TPZStepSolver(pTVar11,&local_2b0);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_2b0);
  local_2b8.fRef = (TPZReference *)local_2d0.fRef;
  LOCK();
  ((local_2d0.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_2d0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*(pTVar11->super_TPZMatrixSolver<double>).super_TPZSolver.super_TPZSavable._vptr_TPZSavable[0xd])
            (pTVar11);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_2b8);
  TPZStepSolver<double>::SetDirect(pTVar11,ECholesky);
  local_2c8.fRef = (TPZReference *)0x0;
  local_2c8.fRef = (TPZReference *)operator_new(0x10);
  ((local_2c8.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_2c8.fRef)->fPointer = (TPZMatrixSolver<double> *)pTVar11;
  LOCK();
  ((local_2c8.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatRed<double,_TPZVerySparseMatrix<double>_>::SetSolver(pTVar3,&local_2c8);
  TPZAutoPointer<TPZMatrixSolver<double>_>::~TPZAutoPointer(&local_2c8);
  iVar7 = pTVar3->fDim1;
  (pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = iVar7;
  (pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = iVar7;
  pTVar3->fIsReduced = true;
  pTVar6 = (TPZMatRed<double,_TPZFMatrix<double>_> *)operator_new(800);
  TPZMatRed<double,TPZFMatrix<double>>::TPZMatRed<TPZVerySparseMatrix<double>>
            ((TPZMatRed<double,TPZFMatrix<double>> *)pTVar6,pTVar3);
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::operator=
            (&pTVar14->fRef->fPointer->fMatRed,pTVar6);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_2d0);
  local_260._40_8_ = local_2e8;
  if ((void *)local_260._48_8_ != (void *)0x0) {
    operator_delete__((void *)local_260._48_8_);
  }
  TPZPairStructMatrix::~TPZPairStructMatrix((TPZPairStructMatrix *)(local_260 + 0x50));
  TPZAutoPointer<TPZMatRed<double,_TPZVerySparseMatrix<double>_>_>::~TPZAutoPointer(&local_298);
  TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
  ::~TPZMatRedStructMatrix(&local_f0);
  local_290._vptr_TPZVec = local_2e8;
  if (local_290.fStore != (long *)0x0) {
    operator_delete__(local_290.fStore);
  }
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_2f0);
  local_100 = local_260._8_8_;
  local_1e8._0_8_ = local_260._0_8_;
  local_1e8._160_8_ = local_268;
  local_120 = local_2e8;
  if (local_118 != (long *)0x0) {
    operator_delete__(local_118);
  }
  local_140 = local_2e8;
  if (local_138 != (void *)0x0) {
    operator_delete__(local_138);
  }
  TPZStructMatrix::~TPZStructMatrix((TPZStructMatrix *)local_1e8,(void **)vtt);
  return;
}

Assistant:

void InitializeMatrices(TPZSubCompMesh *submesh, TPZAutoPointer<TPZDohrSubstructCondense<STATE> > substruct, TPZDohrAssembly<STATE> &dohrassembly)
{
	typedef TPZDohrSubstructCondense<STATE>::ENumbering ENumbering;
	typedef std::pair<ENumbering,ENumbering> pairnumbering;
	pairnumbering fromsub(TPZDohrSubstructCondense<STATE>::Submesh,TPZDohrSubstructCondense<STATE>::InternalFirst);
	TPZVec<int> &permutescatter = substruct->fPermutationsScatter[fromsub];
	
	// create a skyline matrix based on the current numbering of the mesh
	// put the stiffness matrix in a TPZMatRed object to facilitate the computation of phi and zi
	TPZSkylineStructMatrix<STATE> skylstr(submesh);
	skylstr.EquationFilter().Reset();
	
	TPZAutoPointer<TPZMatrix<STATE> > Stiffness = skylstr.Create();
	TPZMatRed<STATE,TPZFMatrix<STATE> > *matredbig = new TPZMatRed<STATE, TPZFMatrix<STATE> >(Stiffness->Rows()+substruct->fCoarseNodes.NElements(),Stiffness->Rows());
	matredbig->SetK00(Stiffness);
	substruct->fMatRedComplete = matredbig;
	
	
	TPZVec<int64_t> permuteconnectscatter;
	
	substruct->fNumInternalEquations = submesh->NumInternalEquations();
	// change the sequencing of the connects of the mesh, putting the internal connects first
	submesh->PermuteInternalFirst(permuteconnectscatter);
	
	// create a "substructure matrix" based on the submesh using a skyline matrix structure as the internal matrix
	TPZMatRedStructMatrix<TPZSkylineStructMatrix<STATE>,TPZVerySparseMatrix<STATE> > redstruct(submesh);
	TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > *matredptr = dynamic_cast<TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > *>(redstruct.Create());
	TPZAutoPointer<TPZMatRed<STATE,TPZVerySparseMatrix<STATE> > > matred = matredptr;
	
	// create a structural matrix which will assemble both stiffnesses simultaneously
	TPZPairStructMatrix pairstructmatrix(submesh,permutescatter);
	
	// reorder the sequence numbering of the connects to reflect the original ordering
	TPZVec<int64_t> invpermuteconnectscatter(permuteconnectscatter.NElements());
	int64_t iel;
	for (iel=0; iel < permuteconnectscatter.NElements(); iel++) {
		invpermuteconnectscatter[permuteconnectscatter[iel]] = iel;
	}
	TPZAutoPointer<TPZMatrix<STATE> > InternalStiffness = matredptr->K00();
	
	
	submesh->Permute(invpermuteconnectscatter);
	
	// compute both stiffness matrices simultaneously
	substruct->fLocalLoad.Redim(Stiffness->Rows(),1);
	pairstructmatrix.Assemble(Stiffness.operator->(), matredptr, substruct->fLocalLoad);
	matredbig->SimetrizeMatRed();
	matredptr->SimetrizeMatRed();
	
	substruct->fWeights.Resize(Stiffness->Rows());
	int64_t i;
	for(i=0; i<substruct->fWeights.NElements(); i++)
	{
		substruct->fWeights[i] = Stiffness->GetVal(i,i);
	}
	// Desingularize the matrix without affecting the solution
	int64_t ncoarse = substruct->fCoarseNodes.NElements(), ic;
	int64_t neq = Stiffness->Rows();
	for(ic=0; ic<ncoarse; ic++)
	{
		int64_t coarse = substruct->fCoarseNodes[ic];
		Stiffness->operator()(coarse,coarse) += 10.;
		matredbig->operator()(neq+ic,coarse) = 1.;
		matredbig->operator()(coarse,neq+ic) = 1.;
	}
	//substruct->fStiffness = Stiffness;
	TPZStepSolver<STATE> *InvertedStiffness = new TPZStepSolver<STATE>(Stiffness);
    InvertedStiffness->SetMatrix(Stiffness);
    InvertedStiffness->SetDirect(ECholesky);
	matredbig->SetSolver(InvertedStiffness);
	
	
	TPZStepSolver<STATE> *InvertedInternalStiffness = new TPZStepSolver<STATE>(InternalStiffness);
    InvertedInternalStiffness->SetMatrix(InternalStiffness);
    InvertedInternalStiffness->SetDirect(ECholesky);
	matredptr->SetSolver(InvertedInternalStiffness);
	matredptr->SetReduced();
	TPZMatRed<STATE,TPZFMatrix<STATE> > *matred2 = new TPZMatRed<STATE,TPZFMatrix<STATE> > (*matredptr);
	
	substruct->fMatRed = matred2;
}